

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O2

bool __thiscall test_CEAngle::runtests(test_CEAngle *this)

{
  undefined1 uVar1;
  
  std::operator<<((ostream *)&std::cout,"\nTesting CEAngle:\n");
  test_construct(this);
  test_setangle(this);
  test_retrieve(this);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  return (bool)uVar1;
}

Assistant:

bool test_CEAngle::runtests()
{
    std::cout << "\nTesting CEAngle:\n";

    // Run each of the tests
    test_construct();
    test_setangle();
    test_retrieve();

    return pass();
}